

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

CURLcode file_do(connectdata *conn,_Bool *done)

{
  Curl_easy *data;
  Curl_easy *data_00;
  undefined8 *puVar1;
  char *pcVar2;
  _Bool _Var3;
  int iVar4;
  CURLcode CVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  curl_off_t cVar9;
  __off64_t _Var10;
  size_t len;
  size_t sVar11;
  undefined8 uVar12;
  bool bVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  size_t sVar17;
  size_t sVar18;
  __off_t size;
  long lVar19;
  bool bVar20;
  curltime cVar21;
  tm buffer;
  char header [80];
  stat statbuf;
  
  data = conn->data;
  pcVar15 = (data->state).buffer;
  *done = true;
  Curl_initinfo(data);
  Curl_pgrsStartNow(data);
  data_00 = conn->data;
  puVar1 = (undefined8 *)(data_00->req).protop;
  if ((data->set).upload != true) {
    iVar4 = *(int *)(puVar1 + 2);
    iVar6 = fstat64(iVar4,(stat64 *)&statbuf);
    size = statbuf.st_size;
    if (iVar6 == -1) {
      size = 0;
    }
    else {
      (data->info).filetime = statbuf.st_mtim.tv_sec;
      if ((((data->state).range == (char *)0x0) && ((data->set).timecondition != CURL_TIMECOND_NONE)
          ) && (_Var3 = Curl_meets_timecondition(data,statbuf.st_mtim.tv_sec), !_Var3)) {
        *done = true;
        return CURLE_OK;
      }
    }
    if ((((data->set).opt_no_body == true) && (iVar6 != -1)) &&
       ((data->set).include_header != false)) {
      curl_msnprintf(header,0x50,"Content-Length: %ld\r\n");
      CVar5 = Curl_client_write(conn,3,header,0);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      CVar5 = Curl_client_write(conn,3,"Accept-ranges: bytes\r\n",0);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      CVar5 = Curl_gmtime(statbuf.st_mtim.tv_sec,&buffer);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      iVar4 = 6;
      if (buffer.tm_wday != 0) {
        iVar4 = buffer.tm_wday + -1;
      }
      curl_msnprintf(header,0x50,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                     Curl_wkday[iVar4],(ulong)(uint)buffer.tm_mday,Curl_month[buffer.tm_mon],
                     (ulong)(buffer.tm_year + 0x76c),(ulong)(uint)buffer.tm_hour,
                     (ulong)(uint)buffer.tm_min,(ulong)(uint)buffer.tm_sec);
      CVar5 = Curl_client_write(conn,3,header,0);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      Curl_pgrsSetDownloadSize(data,size);
      return CURLE_OK;
    }
    CVar5 = Curl_range(conn);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    cVar9 = (data->state).resume_from;
    if (cVar9 < 0) {
      if (iVar6 == -1) {
        Curl_failf(data,"Can\'t get the size of file.");
        return CURLE_READ_ERROR;
      }
      cVar9 = cVar9 + statbuf.st_size;
      (data->state).resume_from = cVar9;
    }
    if (size < cVar9) {
      Curl_failf(data,"failed to resume file:// transfer");
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
    lVar16 = (data->req).maxdownload;
    lVar19 = size - cVar9;
    if (0 < lVar16) {
      lVar19 = lVar16;
    }
    bVar20 = lVar19 != 0;
    if (iVar6 != -1) {
      Curl_pgrsSetDownloadSize(data,lVar19);
      cVar9 = (data->state).resume_from;
    }
    if ((cVar9 != 0) && (_Var10 = lseek64(iVar4,cVar9,0), cVar9 != _Var10)) {
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
    bVar13 = iVar6 != -1 && bVar20;
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
    lVar16 = 0;
    while( true ) {
      sVar18 = (data->set).buffer_size;
      if (iVar6 != -1 && bVar20) {
        if (lVar19 < (long)sVar18) {
          sVar18 = curlx_sotouz(lVar19);
        }
      }
      else {
        sVar18 = sVar18 - 1;
      }
      len = read(iVar4,pcVar15,sVar18);
      CVar5 = CURLE_OK;
      if (((long)len < 1) || (pcVar15[len] = '\0', CVar5 = CURLE_OK, bVar13 && lVar19 == 0))
      goto LAB_0010aa15;
      sVar17 = 0;
      if (bVar13) {
        sVar17 = len;
      }
      CVar5 = Curl_client_write(conn,1,pcVar15,len);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      lVar16 = lVar16 + len;
      Curl_pgrsSetDownloadCounter(data,lVar16);
      iVar7 = Curl_pgrsUpdate(conn);
      if (iVar7 != 0) break;
      lVar19 = lVar19 - sVar17;
      cVar21 = Curl_now();
      CVar5 = Curl_speedcheck(data,cVar21);
      if (CVar5 != CURLE_OK) {
LAB_0010aa15:
        iVar4 = Curl_pgrsUpdate(conn);
        if (iVar4 != 0) {
          return CURLE_ABORTED_BY_CALLBACK;
        }
        return CVar5;
      }
    }
    CVar5 = CURLE_ABORTED_BY_CALLBACK;
    goto LAB_0010aa15;
  }
  pcVar15 = (char *)*puVar1;
  pcVar8 = strchr(pcVar15,0x2f);
  pcVar2 = (data_00->state).buffer;
  (data_00->req).upload_fromhere = pcVar2;
  if (pcVar8 == (char *)0x0) {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  if (pcVar8[1] == '\0') {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  iVar4 = open64(pcVar15,(uint)((data_00->state).resume_from != 0) * 0x200 + 0x241,
                 (data_00->set).new_file_perms);
  if (iVar4 < 0) {
    uVar12 = *puVar1;
    pcVar15 = "Can\'t open %s for writing";
LAB_0010a9a2:
    Curl_failf(data_00,pcVar15,uVar12);
    CVar5 = CURLE_WRITE_ERROR;
  }
  else {
    lVar16 = (data_00->state).infilesize;
    if (lVar16 != -1) {
      Curl_pgrsSetUploadSize(data_00,lVar16);
    }
    if ((data_00->state).resume_from < 0) {
      iVar6 = fstat64(iVar4,(stat64 *)&statbuf);
      if (iVar6 != 0) {
        close(iVar4);
        uVar12 = *puVar1;
        pcVar15 = "Can\'t get the size of %s";
        goto LAB_0010a9a2;
      }
      (data_00->state).resume_from = statbuf.st_size;
    }
    lVar16 = 0;
    while (CVar5 = Curl_fillreadbuffer(conn,(int)(data_00->set).buffer_size,(int *)header),
          CVar5 == CURLE_OK) {
      sVar18 = (size_t)(int)header._0_4_;
      if ((long)sVar18 < 1) {
        iVar6 = Curl_pgrsUpdate(conn);
        CVar5 = CURLE_ABORTED_BY_CALLBACK;
        if (iVar6 == 0) {
          CVar5 = CURLE_OK;
        }
        break;
      }
      lVar19 = (data_00->state).resume_from;
      pcVar15 = pcVar2;
      if (lVar19 != 0) {
        lVar14 = 0;
        if (lVar19 < (long)sVar18) {
          lVar14 = lVar19;
        }
        sVar11 = -(lVar19 - sVar18);
        cVar9 = lVar19 - sVar18;
        if (lVar19 < (long)sVar18) {
          cVar9 = 0;
        }
        else {
          sVar11 = 0;
        }
        (data_00->state).resume_from = cVar9;
        pcVar15 = pcVar2 + lVar14;
        sVar18 = sVar11;
      }
      sVar11 = write(iVar4,pcVar15,sVar18);
      if (sVar11 != sVar18) {
        CVar5 = CURLE_SEND_ERROR;
        break;
      }
      lVar16 = lVar16 + sVar18;
      Curl_pgrsSetUploadCounter(data_00,lVar16);
      iVar6 = Curl_pgrsUpdate(conn);
      if (iVar6 != 0) {
        CVar5 = CURLE_ABORTED_BY_CALLBACK;
        break;
      }
      cVar21 = Curl_now();
      CVar5 = Curl_speedcheck(data_00,cVar21);
      if (CVar5 != CURLE_OK) break;
    }
    close(iVar4);
  }
  return CVar5;
}

Assistant:

static CURLcode file_do(struct connectdata *conn, bool *done)
{
  /* This implementation ignores the host name in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size = 0;
  bool size_known;
  bool fstated = FALSE;
  ssize_t nread;
  struct Curl_easy *data = conn->data;
  char *buf = data->state.buffer;
  curl_off_t bytecount = 0;
  int fd;
  struct FILEPROTO *file;

  *done = TRUE; /* unconditionally */

  Curl_initinfo(data);
  Curl_pgrsStartNow(data);

  if(data->set.upload)
    return file_upload(conn);

  file = conn->data->req.protop;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    /* we could stat it, then read out the size */
    expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition) {
    if(!Curl_meets_timecondition(data, data->info.filetime)) {
      *done = TRUE;
      return CURLE_OK;
    }
  }

  /* If we have selected NOBODY and HEADER, it means that we only want file
     information. Which for FILE can't be much more than the file size and
     date. */
  if(data->set.opt_no_body && data->set.include_header && fstated) {
    time_t filetime;
    struct tm buffer;
    const struct tm *tm = &buffer;
    char header[80];
    snprintf(header, sizeof(header),
             "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n", expected_size);
    result = Curl_client_write(conn, CLIENTWRITE_BOTH, header, 0);
    if(result)
      return result;

    result = Curl_client_write(conn, CLIENTWRITE_BOTH,
                               (char *)"Accept-ranges: bytes\r\n", 0);
    if(result)
      return result;

    filetime = (time_t)statbuf.st_mtime;
    result = Curl_gmtime(filetime, &buffer);
    if(result)
      return result;

    /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
    snprintf(header, sizeof(header),
             "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
             Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
             tm->tm_mday,
             Curl_month[tm->tm_mon],
             tm->tm_year + 1900,
             tm->tm_hour,
             tm->tm_min,
             tm->tm_sec);
    result = Curl_client_write(conn, CLIENTWRITE_BOTH, header, 0);
    if(!result)
      /* set the file size to make it available post transfer */
      Curl_pgrsSetDownloadSize(data, expected_size);
    return result;
  }

  /* Check whether file range has been specified */
  result = Curl_range(conn);
  if(result)
    return result;

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream iff the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "Can't get the size of file.");
      return CURLE_READ_ERROR;
    }
    data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from <= expected_size)
    expected_size -= data->state.resume_from;
  else {
    failf(data, "failed to resume file:// transfer");
    return CURLE_BAD_DOWNLOAD_RESUME;
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(!fstated || (expected_size == 0))
    size_known = FALSE;
  else
    size_known = TRUE;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(fstated)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(data->state.resume_from !=
       lseek(fd, data->state.resume_from, SEEK_SET))
      return CURLE_BAD_DOWNLOAD_RESUME;
  }

  Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  while(!result) {
    /* Don't fill a whole buffer if we want less than all data */
    size_t bytestoread;

    if(size_known) {
      bytestoread = (expected_size < data->set.buffer_size) ?
        curlx_sotouz(expected_size) : (size_t)data->set.buffer_size;
    }
    else
      bytestoread = data->set.buffer_size-1;

    nread = read(fd, buf, bytestoread);

    if(nread > 0)
      buf[nread] = 0;

    if(nread <= 0 || (size_known && (expected_size == 0)))
      break;

    bytecount += nread;
    if(size_known)
      expected_size -= nread;

    result = Curl_client_write(conn, CLIENTWRITE_BODY, buf, nread);
    if(result)
      return result;

    Curl_pgrsSetDownloadCounter(data, bytecount);

    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_now());
  }
  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;

  return result;
}